

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

int lfreepool(lua_State *L)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  size_t sVar3;
  long *plVar4;
  buffer_node *node;
  int i;
  int sz;
  buffer_node *pool;
  lua_State *L_local;
  
  pvVar2 = lua_touserdata(L,1);
  sVar3 = lua_rawlen(L,1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar3;
  for (node._0_4_ = 0; (int)node < SUB164(auVar1 / ZEXT816(0x18),0); node._0_4_ = (int)node + 1) {
    plVar4 = (long *)((long)pvVar2 + (long)(int)node * 0x18);
    if (*plVar4 != 0) {
      free((void *)*plVar4);
      *plVar4 = 0;
    }
  }
  return 0;
}

Assistant:

static int
lfreepool(lua_State *L) {
	struct buffer_node * pool = lua_touserdata(L, 1);
	int sz = lua_rawlen(L,1) / sizeof(*pool);
	int i;
	for (i=0;i<sz;i++) {
		struct buffer_node *node = &pool[i];
		if (node->msg) {
			skynet_free(node->msg);
			node->msg = NULL;
		}
	}
	return 0;
}